

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
::HashElement::operator()(HashElement *this,char (*key) [5])

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  long *local_38;
  ulong local_30;
  long local_28 [2];
  
  local_38 = local_28;
  sVar2 = strlen(*key);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,key,*key + sVar2);
  uVar3 = std::_Hash_bytes(local_38,local_30,0xc70f6907);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  return SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0) +
         SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8);
}

Assistant:

size_t operator()(const K& key, Args&&...) const
				{
					return phmap_mix<sizeof(size_t)>()(h(key));
				}